

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::SupportVectorRegressor::_InternalParse
          (SupportVectorRegressor *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  DenseSupportVectors *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  char cVar2;
  uint32_t tag;
  double *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = (double *)ptr;
LAB_002487d1:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,(char **)&local_48);
    if (bVar1) {
      return (char *)local_48;
    }
    local_48 = (double *)google::protobuf::internal::ReadTag((char *)local_48,&local_3c,0);
    tag_00 = local_3c;
    cVar2 = (char)local_3c;
    switch(local_3c >> 3) {
    case 1:
      if (cVar2 != '\n') break;
      msg = (DenseSupportVectors *)_internal_mutable_kernel(this);
LAB_00248867:
      local_48 = (double *)
                 google::protobuf::internal::ParseContext::ParseMessage
                           (ctx,&msg->super_MessageLite,(char *)local_48);
      goto LAB_00248876;
    case 2:
      if (cVar2 == '\x12') {
        msg = (DenseSupportVectors *)_internal_mutable_sparsesupportvectors(this);
        goto LAB_00248867;
      }
      break;
    case 3:
      if (cVar2 == '\x1a') {
        msg = _internal_mutable_densesupportvectors(this);
        goto LAB_00248867;
      }
      break;
    case 4:
      if (cVar2 == '\"') {
        msg = (DenseSupportVectors *)_internal_mutable_coefficients(this);
        goto LAB_00248867;
      }
      break;
    case 5:
      if (cVar2 == ')') {
        this->rho_ = *local_48;
        local_48 = local_48 + 1;
        goto LAB_002487d1;
      }
    }
    if ((local_3c == 0) || ((local_3c & 7) == 4)) {
      if (local_48 == (double *)0x0) {
        return (char *)0x0;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      return (char *)local_48;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>(local_38);
    local_48 = (double *)
               google::protobuf::internal::UnknownFieldParse(tag_00,unknown,(char *)local_48,ctx);
LAB_00248876:
    if (local_48 == (double *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* SupportVectorRegressor::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.Kernel kernel = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ctx->ParseMessage(_internal_mutable_kernel(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_sparsesupportvectors(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_densesupportvectors(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Coefficients coefficients = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_coefficients(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // double rho = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 41)) {
          rho_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}